

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void h_predictor_8x16xc(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left,int count)

{
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar2 = 0;
  if (0 < (int)left) {
    uVar2 = (ulong)left & 0xffffffff;
  }
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    auVar10 = *(undefined1 (*) [16])above;
    auVar14._0_14_ = auVar10._0_14_;
    auVar14[0xe] = auVar10[7];
    auVar14[0xf] = auVar10[7];
    auVar7._14_2_ = auVar14._14_2_;
    auVar7._0_13_ = auVar10._0_13_;
    auVar7[0xd] = auVar10[6];
    auVar6._13_3_ = auVar7._13_3_;
    auVar6._0_12_ = auVar10._0_12_;
    auVar6[0xc] = auVar10[6];
    auVar5._12_4_ = auVar6._12_4_;
    auVar5._0_11_ = auVar10._0_11_;
    auVar5[0xb] = auVar10[5];
    auVar12._11_5_ = auVar5._11_5_;
    auVar12._0_10_ = auVar10._0_10_;
    auVar12[10] = auVar10[5];
    auVar4._10_6_ = auVar12._10_6_;
    auVar4._0_9_ = auVar10._0_9_;
    auVar4[9] = auVar10[4];
    auVar13._9_7_ = auVar4._9_7_;
    auVar13._0_8_ = auVar10._0_8_;
    auVar13[8] = auVar10[4];
    auVar11._8_8_ = auVar13._8_8_;
    auVar11[7] = auVar10[3];
    auVar11[6] = auVar10[3];
    auVar11[5] = auVar10[2];
    auVar11[4] = auVar10[2];
    auVar11[3] = auVar10[1];
    auVar11[2] = auVar10[1];
    auVar11[1] = auVar10[0];
    auVar11[0] = auVar10[0];
    auVar3[1] = auVar10[8];
    auVar3[0] = auVar10[8];
    auVar3[2] = auVar10[9];
    auVar3[3] = auVar10[9];
    auVar3[4] = auVar10[10];
    auVar3[5] = auVar10[10];
    auVar3[6] = auVar10[0xb];
    auVar3[7] = auVar10[0xb];
    auVar3[8] = auVar10[0xc];
    auVar3[9] = auVar10[0xc];
    auVar3[10] = auVar10[0xd];
    auVar3[0xb] = auVar10[0xd];
    auVar9[0xc] = auVar10[0xe];
    auVar9._0_12_ = auVar3;
    auVar9[0xd] = auVar10[0xe];
    auVar9[0xf] = auVar10[0xf];
    auVar9[0xe] = auVar9[0xf];
    auVar10 = pshuflw(in_XMM2,auVar11,0);
    auVar12 = pshuflw(in_XMM3,auVar11,0x55);
    auVar14 = pshuflw(in_XMM4,auVar11,0xaa);
    in_XMM5 = pshuflw(in_XMM5,auVar11,0xff);
    *(long *)dst = auVar10._0_8_;
    *(long *)(dst + stride) = auVar12._0_8_;
    *(long *)(dst + stride * 2) = auVar14._0_8_;
    *(long *)(dst + stride * 3) = in_XMM5._0_8_;
    auVar8._8_4_ = auVar13._8_4_;
    auVar8._0_8_ = auVar11._8_8_;
    auVar8._12_4_ = auVar5._12_4_;
    auVar11 = pshuflw(auVar10,auVar8,0);
    auVar13 = pshuflw(auVar12,auVar8,0x55);
    auVar14 = pshuflw(auVar14,auVar8,0xaa);
    auVar10 = pshuflw(auVar8,auVar8,0xff);
    *(long *)(dst + stride * 4) = auVar11._0_8_;
    *(long *)(dst + stride * 5) = auVar13._0_8_;
    *(long *)(dst + stride * 6) = auVar14._0_8_;
    *(long *)(dst + stride * 7) = auVar10._0_8_;
    auVar12 = pshuflw(auVar10,auVar9,0);
    auVar11 = pshuflw(auVar11,auVar9,0x55);
    auVar13 = pshuflw(auVar13,auVar9,0xaa);
    in_XMM4 = pshuflw(auVar14,auVar9,0xff);
    *(long *)(dst + stride * 8) = auVar12._0_8_;
    *(long *)(dst + stride * 9) = auVar11._0_8_;
    *(long *)(dst + stride * 10) = auVar13._0_8_;
    *(long *)(dst + stride * 0xb) = in_XMM4._0_8_;
    auVar10._8_4_ = auVar3._8_4_;
    auVar10._12_4_ = auVar9._12_4_;
    auVar10._4_4_ = auVar10._12_4_;
    auVar10._0_4_ = auVar10._8_4_;
    auVar9 = pshuflw(auVar12,auVar10,0);
    in_XMM2 = pshuflw(auVar11,auVar10,0x55);
    in_XMM3 = pshuflw(auVar13,auVar10,0xaa);
    auVar10 = pshuflw(auVar10,auVar10,0xff);
    *(long *)(dst + stride * 0xc) = auVar9._0_8_;
    *(long *)(dst + stride * 0xd) = in_XMM2._0_8_;
    *(long *)(dst + stride * 0xe) = in_XMM3._0_8_;
    *(long *)(dst + stride * 0xf) = auVar10._0_8_;
    above = (uint8_t *)((long)above + 0x10);
    dst = dst + stride * 0x10;
  }
  return;
}

Assistant:

static inline void h_predictor_8x16xc(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, const uint8_t *left,
                                      int count) {
  (void)above;
  for (int i = 0; i < count; ++i) {
    const __m128i left_col = _mm_load_si128((__m128i const *)left);
    __m128i left_col_low = _mm_unpacklo_epi8(left_col, left_col);
    __m128i left_col_high = _mm_unpackhi_epi8(left_col, left_col);

    __m128i row0 = _mm_shufflelo_epi16(left_col_low, 0);
    __m128i row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    __m128i row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    __m128i row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_low = _mm_unpackhi_epi64(left_col_low, left_col_low);
    row0 = _mm_shufflelo_epi16(left_col_low, 0);
    row1 = _mm_shufflelo_epi16(left_col_low, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_low, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_low, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;

    left_col_high = _mm_unpackhi_epi64(left_col_high, left_col_high);
    row0 = _mm_shufflelo_epi16(left_col_high, 0);
    row1 = _mm_shufflelo_epi16(left_col_high, 0x55);
    row2 = _mm_shufflelo_epi16(left_col_high, 0xaa);
    row3 = _mm_shufflelo_epi16(left_col_high, 0xff);
    _mm_storel_epi64((__m128i *)dst, row0);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row1);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row2);
    dst += stride;
    _mm_storel_epi64((__m128i *)dst, row3);
    dst += stride;
    left += 16;
  }
}